

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  Message *descriptor;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  LogMessage local_238;
  string local_200;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      if ((proto->field_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_238,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_238,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar3);
        internal::LogMessage::~LogMessage(&local_238);
      }
      ValidateFieldOptions
                (this,(FieldDescriptor *)(lVar1 + lVar6),
                 (FieldDescriptorProto *)(proto->field_).super_RepeatedPtrFieldBase.elements_[lVar5]
                );
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar5 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x38)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x40);
      if ((proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_238,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_238,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar3);
        internal::LogMessage::~LogMessage(&local_238);
      }
      ValidateMessageOptions
                (this,(Descriptor *)(lVar1 + lVar6),
                 (DescriptorProto *)
                 (proto->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar5 < *(int *)(message + 0x38));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      if ((proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_238,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_238,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar3);
        internal::LogMessage::~LogMessage(&local_238);
      }
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar6),
                          (EnumDescriptorProto *)
                          (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x38;
    } while (lVar5 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x70);
      if ((proto->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_238,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_238,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar3);
        internal::LogMessage::~LogMessage(&local_238);
      }
      ValidateFieldOptions
                (this,(FieldDescriptor *)(lVar1 + lVar6),
                 (FieldDescriptorProto *)
                 (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar5 < *(int *)(message + 0x68));
  }
  lVar5 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x58) != '\0') {
    lVar5 = 0x7fffffff;
  }
  iVar2 = *(int *)(message + 0x58);
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      if (lVar5 + 1 < (long)*(int *)(*(long *)(message + 0x60) + 4 + lVar6 * 8)) {
        element_name = *(string **)(message + 8);
        if ((proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ <= lVar6) {
          internal::LogMessage::LogMessage
                    (&local_238,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                     ,0x338);
          pLVar3 = internal::LogMessage::operator<<(&local_238,"CHECK failed: (index) < (size()): ")
          ;
          internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar3);
          internal::LogMessage::~LogMessage(&local_238);
        }
        descriptor = (Message *)
                     (proto->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar6];
        local_238._0_8_ = FastInt64ToBuffer(lVar5,(char *)((long)&local_238.filename_ + 4));
        sVar4 = strlen((char *)local_238._0_8_);
        local_238.filename_._0_4_ = (undefined4)sVar4;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_200,(strings *)"Extension numbers cannot be greater than $0.",
                   (char *)&local_238,&local_1e0,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                   &local_150,&local_180,&local_1b0,(SubstituteArg *)this);
        AddError(this,element_name,descriptor,NUMBER,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        iVar2 = *(int *)(message + 0x58);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format() ?
                         kint32max :
                         FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}